

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFile.c
# Opt level: O0

deFileResult mapReadWriteResult(deInt64 numBytes)

{
  int *piVar1;
  deInt64 numBytes_local;
  
  if (numBytes < 1) {
    if (numBytes == 0) {
      numBytes_local._4_4_ = DE_FILERESULT_END_OF_FILE;
    }
    else {
      piVar1 = __errno_location();
      numBytes_local._4_4_ = DE_FILERESULT_ERROR;
      if (*piVar1 == 0xb) {
        numBytes_local._4_4_ = DE_FILERESULT_WOULD_BLOCK;
      }
    }
  }
  else {
    numBytes_local._4_4_ = DE_FILERESULT_SUCCESS;
  }
  return numBytes_local._4_4_;
}

Assistant:

static deFileResult mapReadWriteResult (deInt64 numBytes)
{
	if (numBytes > 0)
		return DE_FILERESULT_SUCCESS;
	else if (numBytes == 0)
		return DE_FILERESULT_END_OF_FILE;
	else
		return errno == EAGAIN ? DE_FILERESULT_WOULD_BLOCK : DE_FILERESULT_ERROR;
}